

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O0

void Env_asend_P(Env *env,P *data,size_t n,int proc,int tag,Request_t *request)

{
  Bool_t BVar1;
  int iVar2;
  Request_t *request_local;
  int tag_local;
  int proc_local;
  size_t n_local;
  P *data_local;
  Env *env_local;
  
  BVar1 = Env_mpi_are_values_set_(env);
  if (BVar1 == 0) {
    __assert_fail("Env_mpi_are_values_set_( env )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1b3,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (data == (P *)0x0) {
    __assert_fail("data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1b5,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (n == 0xffffffffffffffff) {
    __assert_fail("n+1 >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                  ,0x1b6,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
  }
  if (-1 < proc) {
    iVar2 = Env_nproc(env);
    if (proc < iVar2) {
      if (tag < 0) {
        __assert_fail("tag>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                      ,0x1b8,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
      }
      if (request != (Request_t *)0x0) {
        return;
      }
      __assert_fail("request != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                    ,0x1b9,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
    }
  }
  __assert_fail("proc>=0 && proc<Env_nproc( env )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                ,0x1b7,"void Env_asend_P(Env *, const P *, size_t, int, int, Request_t *)");
}

Assistant:

void Env_asend_P( Env* env, const P* data, size_t n, int proc, int tag,
                                                          Request_t* request )
{
  Assert( Env_mpi_are_values_set_( env ) );
  Static_Assert( P_IS_DOUBLE );
  Assert( data != NULL );
  Assert( n+1 >= 1 );
  Assert( proc>=0 && proc<Env_nproc( env ) );
  Assert( tag>=0 );
  Assert( request != NULL );

#ifdef USE_MPI
  const int mpi_code = MPI_Isend( (void*)data, n, MPI_DOUBLE, proc, tag,
                                       Env_mpi_active_comm_( env ), request );
  Assert( mpi_code == MPI_SUCCESS );
#endif
}